

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::anon_unknown_0::BlockMultiNestedStructCase::BlockMultiNestedStructCase
          (BlockMultiNestedStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  VarType local_370;
  BufferVar local_358;
  VarType local_318;
  BufferVar local_300;
  VarType local_2c0;
  BufferVar local_2a8;
  VarType local_268;
  BufferVar local_250;
  BufferBlock *local_210;
  BufferBlock *blockB;
  BufferVar local_1f0;
  VarType local_1b0;
  BufferVar local_198;
  VarType local_158;
  BufferVar local_140;
  BufferBlock *local_100;
  BufferBlock *blockA;
  VarType local_e0;
  VarType local_c8;
  StructType *local_b0;
  StructType *typeT;
  VarType local_90;
  VarType local_78;
  VarType local_60;
  StructType *local_38;
  StructType *typeS;
  deUint32 flagsB_local;
  deUint32 flagsA_local;
  char *description_local;
  char *name_local;
  TestContext *testCtx_local;
  BlockMultiNestedStructCase *this_local;
  
  typeS._0_4_ = flagsB;
  typeS._4_4_ = flagsA;
  _flagsB_local = description;
  description_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,description,bufferMode,matrixLoadFlag);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlockMultiNestedStructCase_01669400;
  this->m_flagsA = typeS._4_4_;
  this->m_flagsB = (deUint32)typeS;
  this->m_numInstances = numInstances;
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_38 = pSVar1;
  glu::VarType::VarType(&local_60,TYPE_FLOAT_MAT3,PRECISION_LOWP);
  glu::StructType::addMember(pSVar1,"a",&local_60);
  glu::VarType::~VarType(&local_60);
  pSVar1 = local_38;
  glu::VarType::VarType(&local_90,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_78,&local_90,4);
  glu::StructType::addMember(pSVar1,"b",&local_78);
  glu::VarType::~VarType(&local_78);
  glu::VarType::~VarType(&local_90);
  pSVar1 = local_38;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_b0 = pSVar1;
  glu::VarType::VarType(&local_c8,TYPE_UINT,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_c8);
  glu::VarType::~VarType(&local_c8);
  pSVar1 = local_b0;
  glu::VarType::VarType(&local_e0,local_38);
  glu::StructType::addMember(pSVar1,"b",&local_e0);
  glu::VarType::~VarType(&local_e0);
  pSVar1 = local_b0;
  glu::VarType::VarType((VarType *)&blockA,TYPE_BOOL_VEC4,PRECISION_LAST);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&blockA);
  glu::VarType::~VarType((VarType *)&blockA);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockA");
  local_100 = pBVar2;
  glu::VarType::VarType(&local_158,TYPE_FLOAT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_140,"a",&local_158,0x600);
  BufferBlock::addMember(pBVar2,&local_140);
  BufferVar::~BufferVar(&local_140);
  glu::VarType::~VarType(&local_158);
  pBVar2 = local_100;
  glu::VarType::VarType(&local_1b0,local_38);
  BufferVar::BufferVar(&local_198,"b",&local_1b0,0x400);
  BufferBlock::addMember(pBVar2,&local_198);
  BufferVar::~BufferVar(&local_198);
  glu::VarType::~VarType(&local_1b0);
  pBVar2 = local_100;
  glu::VarType::VarType((VarType *)&blockB,TYPE_UINT_VEC3,PRECISION_LOWP);
  BufferVar::BufferVar(&local_1f0,"c",(VarType *)&blockB,0);
  BufferBlock::addMember(pBVar2,&local_1f0);
  BufferVar::~BufferVar(&local_1f0);
  glu::VarType::~VarType((VarType *)&blockB);
  BufferBlock::setInstanceName(local_100,"blockA");
  BufferBlock::setFlags(local_100,this->m_flagsA);
  pBVar2 = ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockB");
  local_210 = pBVar2;
  glu::VarType::VarType(&local_268,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_250,"a",&local_268,0x400);
  BufferBlock::addMember(pBVar2,&local_250);
  BufferVar::~BufferVar(&local_250);
  glu::VarType::~VarType(&local_268);
  pBVar2 = local_210;
  glu::VarType::VarType(&local_2c0,local_b0);
  BufferVar::BufferVar(&local_2a8,"b",&local_2c0,0x600);
  BufferBlock::addMember(pBVar2,&local_2a8);
  BufferVar::~BufferVar(&local_2a8);
  glu::VarType::~VarType(&local_2c0);
  pBVar2 = local_210;
  glu::VarType::VarType(&local_318,TYPE_BOOL_VEC4,PRECISION_LAST);
  BufferVar::BufferVar(&local_300,"c",&local_318,0);
  BufferBlock::addMember(pBVar2,&local_300);
  BufferVar::~BufferVar(&local_300);
  glu::VarType::~VarType(&local_318);
  pBVar2 = local_210;
  glu::VarType::VarType(&local_370,TYPE_BOOL,PRECISION_LAST);
  BufferVar::BufferVar(&local_358,"d",&local_370,0x600);
  BufferBlock::addMember(pBVar2,&local_358);
  BufferVar::~BufferVar(&local_358);
  glu::VarType::~VarType(&local_370);
  BufferBlock::setInstanceName(local_210,"blockB");
  BufferBlock::setFlags(local_210,this->m_flagsB);
  if (0 < this->m_numInstances) {
    BufferBlock::setArraySize(local_100,this->m_numInstances);
    BufferBlock::setArraySize(local_210,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])();
  return;
}

Assistant:

BlockMultiNestedStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_flagsA			(flagsA)
		, m_flagsB			(flagsB)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_LOWP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP)); // \todo [pyry] UNUSED
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST));

		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(&typeS), ACCESS_WRITE));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}

		init();
	}